

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Al.cpp
# Opt level: O2

void Al::Initialize(int *argc,char ***argv,MPI_Comm world_comm)

{
  bool bVar1;
  ProgressEngine *this;
  char *__s;
  int *sig;
  initializer_list<int> __l;
  allocator_type local_59;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  vector<int,_std::allocator<int>_> handled_signals;
  
  if ((anonymous_namespace)::is_initialized == '\0') {
    internal::mpi::init((EVP_PKEY_CTX *)argc);
    this = (ProgressEngine *)operator_new(0x8100,0x80);
    internal::ProgressEngine::ProgressEngine(this);
    (anonymous_namespace)::is_initialized = '\x01';
    (anonymous_namespace)::progress_engine = this;
    __s = getenv("AL_DISABLE_SIGNAL_HANDLER");
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&handled_signals,__s,(allocator<char> *)&local_58);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &handled_signals,"0");
      std::__cxx11::string::~string((string *)&handled_signals);
      if (!bVar1) {
        return;
      }
    }
    local_58 = 0x600000004;
    uStack_50 = 0x700000008;
    local_48 = 0xb;
    __l._M_len = 5;
    __l._M_array = (iterator)&local_58;
    std::vector<int,_std::allocator<int>_>::vector(&handled_signals,__l,&local_59);
    Initialize::sa.__sigaction_handler.sa_handler = anon_unknown_1::handle_signal;
    Initialize::sa.sa_flags = 0x10000000;
    sigfillset((sigset_t *)&Initialize::sa.sa_mask);
    for (; handled_signals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           handled_signals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
        handled_signals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             handled_signals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 1) {
      sigaction(*handled_signals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,(sigaction *)&Initialize::sa,(sigaction *)0x0);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&handled_signals.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void Initialize(int& argc, char**& argv, MPI_Comm world_comm) {
  // Avoid repeated initialization.
  if (is_initialized) {
    return;
  }
  internal::mpi::init(argc, argv, world_comm);
  progress_engine = new internal::ProgressEngine();
#ifndef AL_PE_START_ON_DEMAND
  progress_engine->run();
#endif
  is_initialized = true;
#ifdef AL_HAS_CUDA
  internal::cuda::init(argc, argv);
#endif
#ifdef AL_HAS_NCCL
  internal::nccl::init(argc, argv);
#endif
#ifdef AL_HAS_MPI_CUDA
  internal::mpi_cuda::init(argc, argv);
#endif
#ifdef AL_HAS_HOST_TRANSFER
  internal::ht::init(argc, argv);
#endif

#ifdef AL_SIGNAL_HANDLER
  // Set AL_DISABLE_SIGNAL_HANDLER to a non-zero value to disable it.
  if (const char* env = std::getenv("AL_DISABLE_SIGNAL_HANDLER");
      env == nullptr || std::string(env) == "0") {
    // Add signal handlers.
    const std::vector<int> handled_signals = {SIGILL, SIGABRT, SIGFPE,
                                              SIGBUS, SIGSEGV};
    static struct sigaction sa;
    sa.sa_handler = &handle_signal;
    sa.sa_flags = SA_RESTART;
    sigfillset(&sa.sa_mask);
    for (const auto& sig : handled_signals) {
      sigaction(sig, &sa, nullptr);
    }
  }
#endif  // AL_SIGNAL_HANDLER
}